

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

Attribute *
Imf_3_4::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
makeNewAttribute(void)

{
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  
  this = (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x28);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  (this->_value)._M_dataplus._M_p = (pointer)0x0;
  (this->_value)._M_string_length = 0;
  (this->_value).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->_value).field_2 + 8) = 0;
  TypedAttribute(this);
  return &this->super_Attribute;
}

Assistant:

Attribute*
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T> ();
}